

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_sources(options_i *options,vw *all,io_buf *model,bool skipModelLoad)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  byte in_CL;
  long *in_RDX;
  long in_RSI;
  size_t params_per_problem;
  uint32_t i;
  input_options parsed_source_options;
  input_options *in_stack_00001a18;
  size_t in_stack_00001a20;
  undefined1 in_stack_00001a2f;
  vw *in_stack_00001a30;
  options_i *in_stack_00001c30;
  vw *in_stack_00001c38;
  parameters *in_stack_ffffffffffffff38;
  io_buf *in_stack_ffffffffffffffc8;
  vw *in_stack_ffffffffffffffd0;
  
  if ((in_CL & 1) == 0) {
    load_input_model(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    (**(code **)(*in_RDX + 0x40))();
  }
  parse_source(in_stack_00001c38,in_stack_00001c30);
  enable_sources(in_stack_00001a30,(bool)in_stack_00001a2f,in_stack_00001a20,in_stack_00001a18);
  for (bVar1 = 0; (ulong)(1L << (bVar1 & 0x3f)) < *(ulong *)(*(long *)(in_RSI + 0x28) + 0xe0);
      bVar1 = bVar1 + 1) {
  }
  iVar2 = 1 << (bVar1 & 0x1f);
  uVar3 = parameters::stride_shift(in_stack_ffffffffffffff38);
  *(int *)(in_RSI + 0x288) = iVar2 >> ((byte)uVar3 & 0x1f);
  input_options::~input_options((input_options *)CONCAT44(uVar3,iVar2));
  return;
}

Assistant:

void parse_sources(options_i& options, vw& all, io_buf& model, bool skipModelLoad)
{
  if (!skipModelLoad)
    load_input_model(all, model);
  else
    model.close_file();

  auto parsed_source_options = parse_source(all, options);
  enable_sources(all, all.quiet, all.numpasses, parsed_source_options);

  // force wpp to be a power of 2 to avoid 32-bit overflow
  uint32_t i = 0;
  size_t params_per_problem = all.l->increment;
  while (params_per_problem > ((uint64_t)1 << i)) i++;
  all.wpp = (1 << i) >> all.weights.stride_shift();
}